

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O1

void __thiscall EmmyDebuggerManager::RemoveAllBreakpoints(EmmyDebuggerManager *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->breakpointsMtx);
  if (iVar1 == 0) {
    std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>::clear
              (&this->breakpoints);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
              (&(this->lineSet)._M_t);
    pthread_mutex_unlock((pthread_mutex_t *)&this->breakpointsMtx);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void EmmyDebuggerManager::RemoveAllBreakpoints()
{
	std::lock_guard<std::mutex> lock(breakpointsMtx);
	breakpoints.clear();
	lineSet.clear();
}